

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rhombicLattice.cpp
# Opt level: O1

void __thiscall RhombicLattice::createFaces(RhombicLattice *this)

{
  Lattice *pLVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  int vertexIndex;
  char *__end;
  long *plVar7;
  long lVar8;
  double dVar9;
  cartesian4 cVar10;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<int> __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  initializer_list<int> __l_02;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_03;
  initializer_list<int> __l_04;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_05;
  initializer_list<int> __l_06;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_07;
  initializer_list<int> __l_08;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_09;
  initializer_list<int> __l_10;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_11;
  initializer_list<int> __l_12;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_13;
  initializer_list<int> __l_14;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_15;
  initializer_list<int> __l_16;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_17;
  initializer_list<int> __l_18;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_19;
  initializer_list<int> __l_20;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_21;
  initializer_list<int> __l_22;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_23;
  initializer_list<int> __l_24;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_25;
  initializer_list<int> __l_26;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_27;
  initializer_list<int> __l_28;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_29;
  initializer_list<int> __l_30;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_31;
  initializer_list<int> __l_32;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_33;
  initializer_list<int> __l_34;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_35;
  initializer_list<int> __l_36;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_37;
  initializer_list<int> __l_38;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_39;
  initializer_list<int> __l_40;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_41;
  initializer_list<int> __l_42;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_43;
  initializer_list<int> __l_44;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_45;
  initializer_list<int> __l_46;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_47;
  initializer_list<int> __l_48;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_49;
  initializer_list<int> __l_50;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_51;
  initializer_list<int> __l_52;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_53;
  initializer_list<int> __l_54;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_55;
  initializer_list<int> __l_56;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_57;
  initializer_list<int> __l_58;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_59;
  initializer_list<int> __l_60;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_61;
  initializer_list<int> __l_62;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_63;
  initializer_list<int> __l_64;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_65;
  initializer_list<int> __l_66;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_67;
  initializer_list<int> __l_68;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_69;
  initializer_list<int> __l_70;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_71;
  initializer_list<int> __l_72;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_73;
  initializer_list<int> __l_74;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_75;
  initializer_list<int> __l_76;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_77;
  initializer_list<int> __l_78;
  allocator_type local_24a;
  allocator_type local_249;
  ulong local_248;
  vector<int,_std::allocator<int>_> local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  undefined1 *local_208 [2];
  undefined1 local_1f8 [16];
  undefined1 *local_1e8 [2];
  undefined1 local_1d8 [16];
  long *local_1c8 [2];
  long local_1b8 [2];
  int local_1a8 [4];
  Lattice *local_198;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_190;
  undefined1 **local_178;
  undefined1 **local_170;
  undefined1 **local_168;
  undefined1 **local_160;
  undefined1 **local_158;
  undefined1 **local_150;
  undefined1 **local_148;
  undefined1 **local_140;
  undefined1 **local_138;
  undefined1 **local_130;
  undefined1 **local_128;
  undefined1 **local_120;
  undefined1 **local_118;
  undefined1 **local_110;
  undefined1 **local_108;
  undefined1 **local_100;
  undefined1 **local_f8;
  undefined1 **local_f0;
  undefined1 **local_e8;
  undefined1 **local_e0;
  undefined1 **local_d8;
  undefined1 **local_d0;
  undefined1 **local_c8;
  undefined1 **local_c0;
  undefined1 **local_b8;
  undefined1 **local_b0;
  undefined1 **local_a8;
  undefined1 **local_a0;
  undefined1 **local_98;
  undefined1 **local_90;
  undefined1 **local_88;
  undefined1 **local_80;
  undefined1 **local_78;
  undefined1 **local_70;
  undefined1 **local_68;
  undefined1 **local_60;
  undefined1 **local_58;
  undefined1 **local_50;
  undefined1 **local_48;
  undefined1 **local_40;
  double local_38;
  
  dVar9 = pow((double)(this->super_Lattice).l,3.0);
  if (0.0 < dVar9) {
    local_178 = local_208;
    local_248 = 0;
    vertexIndex = 0;
    local_198 = &this->super_Lattice;
    local_170 = local_178;
    local_168 = local_178;
    local_160 = local_178;
    local_158 = local_178;
    local_150 = local_178;
    local_148 = local_178;
    local_140 = local_178;
    local_138 = local_178;
    local_130 = local_178;
    local_128 = local_178;
    local_120 = local_178;
    local_118 = local_178;
    local_110 = local_178;
    local_108 = local_178;
    local_100 = local_178;
    local_f8 = local_178;
    local_f0 = local_178;
    local_e8 = local_178;
    local_e0 = local_178;
    local_d8 = local_178;
    local_d0 = local_178;
    local_c8 = local_178;
    local_c0 = local_178;
    local_b8 = local_178;
    local_b0 = local_178;
    local_a8 = local_178;
    local_a0 = local_178;
    local_98 = local_178;
    local_90 = local_178;
    local_88 = local_178;
    local_80 = local_178;
    local_78 = local_178;
    local_70 = local_178;
    local_68 = local_178;
    local_60 = local_178;
    local_58 = local_178;
    local_50 = local_178;
    local_48 = local_178;
    local_40 = local_178;
    do {
      cVar10 = Lattice::indexToCoordinate(&this->super_Lattice,vertexIndex);
      uVar5 = cVar10.z;
      if (uVar5 != 0) {
        uVar4 = cVar10._0_8_ >> 0x20;
        uVar2 = cVar10.x;
        uVar3 = cVar10.y;
        if ((uVar2 + uVar5 + uVar3 & 0x80000001) == 1) {
          if ((uVar5 & 0x80000001) == 1) {
            if (uVar4 == 0) {
              local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"xyz","");
              local_208[0] = local_1f8;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"xy","");
              local_1e8[0] = local_1d8;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"xy","");
              local_1c8[0] = local_1b8;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"xyz","");
              __l._M_len = 4;
              __l._M_array = &local_228;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector(&local_190,__l,&local_249);
              local_1a8[0] = 1;
              local_1a8[1] = 1;
              local_1a8[2] = 1;
              local_1a8[3] = 1;
              __l_00._M_len = 4;
              __l_00._M_array = local_1a8;
              std::vector<int,_std::allocator<int>_>::vector(&local_240,__l_00,&local_24a);
              Lattice::addFace(&this->super_Lattice,vertexIndex,(int)local_248,&local_190,&local_240
                              );
              if (local_240.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_240.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start,
                                (long)local_240.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_240.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_start);
              }
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&local_190);
              lVar8 = -0x80;
              plVar7 = local_1b8;
              do {
                if (plVar7 != (long *)plVar7[-2]) {
                  operator_delete((long *)plVar7[-2],*plVar7 + 1);
                }
                plVar7 = plVar7 + -4;
                lVar8 = lVar8 + 0x20;
              } while (lVar8 != 0);
              uVar2 = (int)local_248 + 1;
LAB_0012611c:
              local_248 = (ulong)uVar2;
            }
            else if (uVar2 == 0) {
              local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"xyz","");
              local_208[0] = local_1f8;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"xy","");
              local_1e8[0] = local_1d8;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"xy","");
              local_1c8[0] = local_1b8;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"xyz","");
              __l_15._M_len = 4;
              __l_15._M_array = &local_228;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector(&local_190,__l_15,&local_249);
              local_1a8[0] = 1;
              local_1a8[1] = 1;
              local_1a8[2] = 1;
              local_1a8[3] = 1;
              __l_16._M_len = 4;
              __l_16._M_array = local_1a8;
              std::vector<int,_std::allocator<int>_>::vector(&local_240,__l_16,&local_24a);
              Lattice::addFace(&this->super_Lattice,vertexIndex,(int)local_248,&local_190,&local_240
                              );
              if (local_240.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_240.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start,
                                (long)local_240.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_240.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_start);
              }
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&local_190);
              lVar8 = -0x80;
              plVar7 = local_1b8;
              do {
                if (plVar7 != (long *)plVar7[-2]) {
                  operator_delete((long *)plVar7[-2],*plVar7 + 1);
                }
                pLVar1 = local_198;
                plVar7 = plVar7 + -4;
                lVar8 = lVar8 + 0x20;
              } while (lVar8 != 0);
              uVar2 = (int)local_248 + 1;
              if (local_198->l - 1U != uVar5) {
                local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"xyz","");
                local_208[0] = local_1f8;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"xz","");
                local_1e8[0] = local_1d8;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"xz","");
                local_1c8[0] = local_1b8;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"xyz","");
                __l_17._M_len = 4;
                __l_17._M_array = &local_228;
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::vector(&local_190,__l_17,&local_249);
                local_1a8[0] = 1;
                local_1a8[1] = 1;
                local_1a8[2] = 1;
                local_1a8[3] = 1;
                __l_18._M_len = 4;
                __l_18._M_array = local_1a8;
                std::vector<int,_std::allocator<int>_>::vector(&local_240,__l_18,&local_24a);
                Lattice::addFace(pLVar1,vertexIndex,uVar2,&local_190,&local_240);
                if (local_240.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_240.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start,
                                  (long)local_240.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_240.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_start);
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(&local_190);
                lVar8 = -0x80;
                plVar7 = local_1b8;
                do {
                  if (plVar7 != (long *)plVar7[-2]) {
                    operator_delete((long *)plVar7[-2],*plVar7 + 1);
                  }
                  plVar7 = plVar7 + -4;
                  lVar8 = lVar8 + 0x20;
                } while (lVar8 != 0);
                uVar2 = (int)local_248 + 2;
              }
              pLVar1 = local_198;
              this = (RhombicLattice *)local_198;
              if (uVar5 == 1) goto LAB_0012611c;
              local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"xy","");
              local_208[0] = local_1f8;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"yz","");
              local_1e8[0] = local_1d8;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"yz","");
              local_1c8[0] = local_1b8;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"xy","");
              __l_27._M_len = 4;
              __l_27._M_array = &local_228;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector(&local_190,__l_27,&local_249);
              local_1a8[0] = 1;
              local_1a8[1] = -1;
              local_1a8[2] = -1;
              local_1a8[3] = 1;
              __l_28._M_len = 4;
              __l_28._M_array = local_1a8;
              std::vector<int,_std::allocator<int>_>::vector(&local_240,__l_28,&local_24a);
              Lattice::addFace(pLVar1,vertexIndex,uVar2,&local_190,&local_240);
              if (local_240.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_240.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start,
                                (long)local_240.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_240.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_start);
              }
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&local_190);
              lVar8 = -0x80;
              plVar7 = local_1b8;
              do {
                if (plVar7 != (long *)plVar7[-2]) {
                  operator_delete((long *)plVar7[-2],*plVar7 + 1);
                }
                plVar7 = plVar7 + -4;
                lVar8 = lVar8 + 0x20;
              } while (lVar8 != 0);
LAB_001287a9:
              local_248 = (ulong)(uVar2 + 1);
              this = (RhombicLattice *)local_198;
            }
            else {
              uVar6 = (this->super_Lattice).l - 1;
              if (uVar6 == uVar2) {
                if (uVar6 != uVar3) {
                  local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"yz","");
                  local_208[0] = local_1f8;
                  std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"xz","");
                  local_1e8[0] = local_1d8;
                  std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"xz","");
                  local_1c8[0] = local_1b8;
                  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"yz","");
                  __l_07._M_len = 4;
                  __l_07._M_array = &local_228;
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::vector(&local_190,__l_07,&local_249);
                  local_1a8[0] = 1;
                  local_1a8[1] = -1;
                  local_1a8[2] = -1;
                  local_1a8[3] = 1;
                  __l_08._M_len = 4;
                  __l_08._M_array = local_1a8;
                  std::vector<int,_std::allocator<int>_>::vector(&local_240,__l_08,&local_24a);
                  Lattice::addFace(&this->super_Lattice,vertexIndex,(int)local_248,&local_190,
                                   &local_240);
                  if (local_240.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start != (pointer)0x0) {
                    operator_delete(local_240.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start,
                                    (long)local_240.super__Vector_base<int,_std::allocator<int>_>.
                                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                                    (long)local_240.super__Vector_base<int,_std::allocator<int>_>.
                                          _M_impl.super__Vector_impl_data._M_start);
                  }
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector(&local_190);
                  lVar8 = -0x80;
                  plVar7 = local_1b8;
                  do {
                    if (plVar7 != (long *)plVar7[-2]) {
                      operator_delete((long *)plVar7[-2],*plVar7 + 1);
                    }
                    pLVar1 = local_198;
                    plVar7 = plVar7 + -4;
                    lVar8 = lVar8 + 0x20;
                  } while (lVar8 != 0);
                  uVar2 = (int)local_248 + 1;
                  if (local_198->l - 1U != uVar5) {
                    local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
                    std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"xy","");
                    local_208[0] = local_1f8;
                    std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"yz","");
                    local_1e8[0] = local_1d8;
                    std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"yz","");
                    local_1c8[0] = local_1b8;
                    std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"xy","");
                    __l_09._M_len = 4;
                    __l_09._M_array = &local_228;
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::vector(&local_190,__l_09,&local_249);
                    local_1a8[0] = -1;
                    local_1a8[1] = 1;
                    local_1a8[2] = 1;
                    local_1a8[3] = -1;
                    __l_10._M_len = 4;
                    __l_10._M_array = local_1a8;
                    std::vector<int,_std::allocator<int>_>::vector(&local_240,__l_10,&local_24a);
                    Lattice::addFace(pLVar1,vertexIndex,uVar2,&local_190,&local_240);
                    if (local_240.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start != (pointer)0x0) {
                      operator_delete(local_240.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_start,
                                      (long)local_240.super__Vector_base<int,_std::allocator<int>_>.
                                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)local_240.super__Vector_base<int,_std::allocator<int>_>.
                                            _M_impl.super__Vector_impl_data._M_start);
                    }
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::~vector(&local_190);
                    lVar8 = -0x80;
                    plVar7 = local_1b8;
                    do {
                      if (plVar7 != (long *)plVar7[-2]) {
                        operator_delete((long *)plVar7[-2],*plVar7 + 1);
                      }
                      plVar7 = plVar7 + -4;
                      lVar8 = lVar8 + 0x20;
                    } while (lVar8 != 0);
                    uVar2 = (int)local_248 + 2;
                  }
                  pLVar1 = local_198;
                  if (uVar5 != 1) {
                    local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
                    std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"xyz","");
                    local_208[0] = local_1f8;
                    std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"xz","");
                    local_1e8[0] = local_1d8;
                    std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"xz","");
                    local_1c8[0] = local_1b8;
                    std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"xyz","");
                    __l_57._M_len = 4;
                    __l_57._M_array = &local_228;
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::vector(&local_190,__l_57,&local_249);
                    local_1a8[0] = -1;
                    local_1a8[1] = -1;
                    local_1a8[2] = -1;
                    local_1a8[3] = -1;
                    __l_58._M_len = 4;
                    __l_58._M_array = local_1a8;
                    std::vector<int,_std::allocator<int>_>::vector(&local_240,__l_58,&local_24a);
                    Lattice::addFace(pLVar1,vertexIndex,uVar2,&local_190,&local_240);
                    if (local_240.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start != (pointer)0x0) {
                      operator_delete(local_240.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_start,
                                      (long)local_240.super__Vector_base<int,_std::allocator<int>_>.
                                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)local_240.super__Vector_base<int,_std::allocator<int>_>.
                                            _M_impl.super__Vector_impl_data._M_start);
                    }
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::~vector(&local_190);
                    lVar8 = -0x80;
                    plVar7 = local_1b8;
                    do {
                      if (plVar7 != (long *)plVar7[-2]) {
                        operator_delete((long *)plVar7[-2],*plVar7 + 1);
                      }
                      plVar7 = plVar7 + -4;
                      lVar8 = lVar8 + 0x20;
                    } while (lVar8 != 0);
                    goto LAB_001287a9;
                  }
                  local_248 = (ulong)uVar2;
                  this = (RhombicLattice *)local_198;
                }
              }
              else {
                if (uVar6 == uVar3) {
                  local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"xz","");
                  local_208[0] = local_1f8;
                  std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"yz","");
                  local_1e8[0] = local_1d8;
                  std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"yz","");
                  local_1c8[0] = local_1b8;
                  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"xz","");
                  __l_19._M_len = 4;
                  __l_19._M_array = &local_228;
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::vector(&local_190,__l_19,&local_249);
                  local_1a8[0] = 1;
                  local_1a8[1] = -1;
                  local_1a8[2] = -1;
                  local_1a8[3] = 1;
                  __l_20._M_len = 4;
                  __l_20._M_array = local_1a8;
                  std::vector<int,_std::allocator<int>_>::vector(&local_240,__l_20,&local_24a);
                  Lattice::addFace(&this->super_Lattice,vertexIndex,(int)local_248,&local_190,
                                   &local_240);
                  if (local_240.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start != (pointer)0x0) {
                    operator_delete(local_240.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start,
                                    (long)local_240.super__Vector_base<int,_std::allocator<int>_>.
                                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                                    (long)local_240.super__Vector_base<int,_std::allocator<int>_>.
                                          _M_impl.super__Vector_impl_data._M_start);
                  }
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector(&local_190);
                  lVar8 = -0x80;
                  plVar7 = local_1b8;
                  do {
                    if (plVar7 != (long *)plVar7[-2]) {
                      operator_delete((long *)plVar7[-2],*plVar7 + 1);
                    }
                    plVar7 = plVar7 + -4;
                    lVar8 = lVar8 + 0x20;
                  } while (lVar8 != 0);
                  goto LAB_00126ebc;
                }
                if (((undefined1  [16])cVar10 & (undefined1  [16])0x100000000) ==
                    (undefined1  [16])0x0 && (int)uVar2 % 2 == 0) {
                  if (uVar6 != uVar5) {
                    local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
                    std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"xyz","");
                    local_208[0] = local_1f8;
                    std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"xz","");
                    local_1e8[0] = local_1d8;
                    std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"xz","");
                    local_1c8[0] = local_1b8;
                    std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"xyz","");
                    __l_59._M_len = 4;
                    __l_59._M_array = &local_228;
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::vector(&local_190,__l_59,&local_249);
                    local_1a8[0] = 1;
                    local_1a8[1] = 1;
                    local_1a8[2] = 1;
                    local_1a8[3] = 1;
                    __l_60._M_len = 4;
                    __l_60._M_array = local_1a8;
                    std::vector<int,_std::allocator<int>_>::vector(&local_240,__l_60,&local_24a);
                    Lattice::addFace(&this->super_Lattice,vertexIndex,(int)local_248,&local_190,
                                     &local_240);
                    if (local_240.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start != (pointer)0x0) {
                      operator_delete(local_240.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_start,
                                      (long)local_240.super__Vector_base<int,_std::allocator<int>_>.
                                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)local_240.super__Vector_base<int,_std::allocator<int>_>.
                                            _M_impl.super__Vector_impl_data._M_start);
                    }
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::~vector(&local_190);
                    lVar8 = -0x80;
                    plVar7 = local_1b8;
                    do {
                      if (plVar7 != (long *)plVar7[-2]) {
                        operator_delete((long *)plVar7[-2],*plVar7 + 1);
                      }
                      plVar7 = plVar7 + -4;
                      lVar8 = lVar8 + 0x20;
                    } while (lVar8 != 0);
                    local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
                    std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"xy","");
                    local_208[0] = local_1f8;
                    std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"yz","");
                    pLVar1 = local_198;
                    local_1e8[0] = local_1d8;
                    std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"yz","");
                    local_1c8[0] = local_1b8;
                    std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"xy","");
                    __l_61._M_len = 4;
                    __l_61._M_array = &local_228;
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::vector(&local_190,__l_61,&local_249);
                    local_1a8[0] = -1;
                    local_1a8[1] = 1;
                    local_1a8[2] = 1;
                    local_1a8[3] = -1;
                    __l_62._M_len = 4;
                    __l_62._M_array = local_1a8;
                    std::vector<int,_std::allocator<int>_>::vector(&local_240,__l_62,&local_24a);
                    Lattice::addFace(pLVar1,vertexIndex,(int)local_248 + 1,&local_190,&local_240);
                    if (local_240.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start != (pointer)0x0) {
                      operator_delete(local_240.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_start,
                                      (long)local_240.super__Vector_base<int,_std::allocator<int>_>.
                                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)local_240.super__Vector_base<int,_std::allocator<int>_>.
                                            _M_impl.super__Vector_impl_data._M_start);
                    }
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::~vector(&local_190);
                    lVar8 = -0x80;
                    plVar7 = local_1b8;
                    do {
                      if (plVar7 != (long *)plVar7[-2]) {
                        operator_delete((long *)plVar7[-2],*plVar7 + 1);
                      }
                      plVar7 = plVar7 + -4;
                      lVar8 = lVar8 + 0x20;
                    } while (lVar8 != 0);
                    local_248 = (ulong)((int)local_248 + 2);
                    this = (RhombicLattice *)local_198;
                  }
                  if (uVar5 != 1) {
                    local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
                    std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"xy","");
                    local_208[0] = local_1f8;
                    std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"yz","");
                    local_1e8[0] = local_1d8;
                    std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"yz","");
                    local_1c8[0] = local_1b8;
                    std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"xy","");
                    __l_63._M_len = 4;
                    __l_63._M_array = &local_228;
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::vector(&local_190,__l_63,&local_249);
                    local_1a8[0] = 1;
                    local_1a8[1] = -1;
                    local_1a8[2] = -1;
                    local_1a8[3] = 1;
                    __l_64._M_len = 4;
                    __l_64._M_array = local_1a8;
                    std::vector<int,_std::allocator<int>_>::vector(&local_240,__l_64,&local_24a);
                    Lattice::addFace(&this->super_Lattice,vertexIndex,(int)local_248,&local_190,
                                     &local_240);
                    if (local_240.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start != (pointer)0x0) {
                      operator_delete(local_240.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_start,
                                      (long)local_240.super__Vector_base<int,_std::allocator<int>_>.
                                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)local_240.super__Vector_base<int,_std::allocator<int>_>.
                                            _M_impl.super__Vector_impl_data._M_start);
                    }
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::~vector(&local_190);
                    lVar8 = -0x80;
                    plVar7 = local_1b8;
                    do {
                      if (plVar7 != (long *)plVar7[-2]) {
                        operator_delete((long *)plVar7[-2],*plVar7 + 1);
                      }
                      plVar7 = plVar7 + -4;
                      lVar8 = lVar8 + 0x20;
                    } while (lVar8 != 0);
                    local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
                    std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"xyz","");
                    local_208[0] = local_1f8;
                    std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"xz","");
                    pLVar1 = local_198;
                    local_1e8[0] = local_1d8;
                    std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"xz","");
                    local_1c8[0] = local_1b8;
                    std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"xyz","");
                    __l_65._M_len = 4;
                    __l_65._M_array = &local_228;
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::vector(&local_190,__l_65,&local_249);
                    local_1a8[0] = -1;
                    local_1a8[1] = -1;
                    local_1a8[2] = -1;
                    local_1a8[3] = -1;
                    __l_66._M_len = 4;
                    __l_66._M_array = local_1a8;
                    std::vector<int,_std::allocator<int>_>::vector(&local_240,__l_66,&local_24a);
                    Lattice::addFace(pLVar1,vertexIndex,(int)local_248 + 1,&local_190,&local_240);
                    if (local_240.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start != (pointer)0x0) {
                      operator_delete(local_240.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_start,
                                      (long)local_240.super__Vector_base<int,_std::allocator<int>_>.
                                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)local_240.super__Vector_base<int,_std::allocator<int>_>.
                                            _M_impl.super__Vector_impl_data._M_start);
                    }
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::~vector(&local_190);
                    lVar8 = -0x80;
                    plVar7 = local_1b8;
                    do {
                      if (plVar7 != (long *)plVar7[-2]) {
                        operator_delete((long *)plVar7[-2],*plVar7 + 1);
                      }
                      plVar7 = plVar7 + -4;
                      lVar8 = lVar8 + 0x20;
                    } while (lVar8 != 0);
                    local_248 = (ulong)((int)local_248 + 2);
                    this = (RhombicLattice *)local_198;
                  }
                  local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"xyz","");
                  local_208[0] = local_1f8;
                  std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"xy","");
                  local_1e8[0] = local_1d8;
                  std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"xy","");
                  local_1c8[0] = local_1b8;
                  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"xyz","");
                  __l_67._M_len = 4;
                  __l_67._M_array = &local_228;
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::vector(&local_190,__l_67,&local_249);
                  local_1a8[0] = 1;
                  local_1a8[1] = 1;
                  local_1a8[2] = 1;
                  local_1a8[3] = 1;
                  __l_68._M_len = 4;
                  __l_68._M_array = local_1a8;
                  std::vector<int,_std::allocator<int>_>::vector(&local_240,__l_68,&local_24a);
                  Lattice::addFace(&this->super_Lattice,vertexIndex,(int)local_248,&local_190,
                                   &local_240);
                  if (local_240.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start != (pointer)0x0) {
                    operator_delete(local_240.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start,
                                    (long)local_240.super__Vector_base<int,_std::allocator<int>_>.
                                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                                    (long)local_240.super__Vector_base<int,_std::allocator<int>_>.
                                          _M_impl.super__Vector_impl_data._M_start);
                  }
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector(&local_190);
                  lVar8 = -0x80;
                  plVar7 = local_1b8;
                  do {
                    if (plVar7 != (long *)plVar7[-2]) {
                      operator_delete((long *)plVar7[-2],*plVar7 + 1);
                    }
                    plVar7 = plVar7 + -4;
                    lVar8 = lVar8 + 0x20;
                  } while (lVar8 != 0);
                  local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"xyz","");
                  local_208[0] = local_1f8;
                  std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"xy","");
                  pLVar1 = local_198;
                  local_1e8[0] = local_1d8;
                  std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"xy","");
                  local_1c8[0] = local_1b8;
                  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"xyz","");
                  __l_69._M_len = 4;
                  __l_69._M_array = &local_228;
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::vector(&local_190,__l_69,&local_249);
                  local_1a8[0] = -1;
                  local_1a8[1] = -1;
                  local_1a8[2] = -1;
                  local_1a8[3] = -1;
                  __l_70._M_len = 4;
                  __l_70._M_array = local_1a8;
                  std::vector<int,_std::allocator<int>_>::vector(&local_240,__l_70,&local_24a);
                  Lattice::addFace(pLVar1,vertexIndex,(int)local_248 + 1,&local_190,&local_240);
                  if (local_240.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start != (pointer)0x0) {
                    operator_delete(local_240.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start,
                                    (long)local_240.super__Vector_base<int,_std::allocator<int>_>.
                                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                                    (long)local_240.super__Vector_base<int,_std::allocator<int>_>.
                                          _M_impl.super__Vector_impl_data._M_start);
                  }
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector(&local_190);
                  lVar8 = -0x80;
                  plVar7 = local_1b8;
                  do {
                    if (plVar7 != (long *)plVar7[-2]) {
                      operator_delete((long *)plVar7[-2],*plVar7 + 1);
                    }
                    plVar7 = plVar7 + -4;
                    lVar8 = lVar8 + 0x20;
                  } while (lVar8 != 0);
                }
                else {
                  if ((uVar3 & 0x80000001) != 1 || (int)uVar2 % 2 != 1) goto LAB_001294c5;
                  if (uVar6 != uVar5) {
                    local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
                    std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"xyz","");
                    local_208[0] = local_1f8;
                    std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"xz","");
                    local_1e8[0] = local_1d8;
                    std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"xz","");
                    local_1c8[0] = local_1b8;
                    std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"xyz","");
                    __l_29._M_len = 4;
                    __l_29._M_array = &local_228;
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::vector(&local_190,__l_29,&local_249);
                    local_1a8[0] = 1;
                    local_1a8[1] = 1;
                    local_1a8[2] = 1;
                    local_1a8[3] = 1;
                    __l_30._M_len = 4;
                    __l_30._M_array = local_1a8;
                    std::vector<int,_std::allocator<int>_>::vector(&local_240,__l_30,&local_24a);
                    Lattice::addFace(&this->super_Lattice,vertexIndex,(int)local_248,&local_190,
                                     &local_240);
                    if (local_240.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start != (pointer)0x0) {
                      operator_delete(local_240.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_start,
                                      (long)local_240.super__Vector_base<int,_std::allocator<int>_>.
                                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)local_240.super__Vector_base<int,_std::allocator<int>_>.
                                            _M_impl.super__Vector_impl_data._M_start);
                    }
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::~vector(&local_190);
                    lVar8 = -0x80;
                    plVar7 = local_1b8;
                    do {
                      if (plVar7 != (long *)plVar7[-2]) {
                        operator_delete((long *)plVar7[-2],*plVar7 + 1);
                      }
                      plVar7 = plVar7 + -4;
                      lVar8 = lVar8 + 0x20;
                    } while (lVar8 != 0);
                    local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
                    std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"xy","");
                    local_208[0] = local_1f8;
                    std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"yz","");
                    pLVar1 = local_198;
                    local_1e8[0] = local_1d8;
                    std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"yz","");
                    local_1c8[0] = local_1b8;
                    std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"xy","");
                    __l_31._M_len = 4;
                    __l_31._M_array = &local_228;
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::vector(&local_190,__l_31,&local_249);
                    local_1a8[0] = -1;
                    local_1a8[1] = 1;
                    local_1a8[2] = 1;
                    local_1a8[3] = -1;
                    __l_32._M_len = 4;
                    __l_32._M_array = local_1a8;
                    std::vector<int,_std::allocator<int>_>::vector(&local_240,__l_32,&local_24a);
                    Lattice::addFace(pLVar1,vertexIndex,(int)local_248 + 1,&local_190,&local_240);
                    if (local_240.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start != (pointer)0x0) {
                      operator_delete(local_240.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_start,
                                      (long)local_240.super__Vector_base<int,_std::allocator<int>_>.
                                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)local_240.super__Vector_base<int,_std::allocator<int>_>.
                                            _M_impl.super__Vector_impl_data._M_start);
                    }
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::~vector(&local_190);
                    lVar8 = -0x80;
                    plVar7 = local_1b8;
                    do {
                      if (plVar7 != (long *)plVar7[-2]) {
                        operator_delete((long *)plVar7[-2],*plVar7 + 1);
                      }
                      plVar7 = plVar7 + -4;
                      lVar8 = lVar8 + 0x20;
                    } while (lVar8 != 0);
                    local_248 = (ulong)((int)local_248 + 2);
                    this = (RhombicLattice *)local_198;
                  }
                  if (uVar5 != 1) {
                    local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
                    std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"xy","");
                    local_208[0] = local_1f8;
                    std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"yz","");
                    local_1e8[0] = local_1d8;
                    std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"yz","");
                    local_1c8[0] = local_1b8;
                    std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"xy","");
                    __l_71._M_len = 4;
                    __l_71._M_array = &local_228;
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::vector(&local_190,__l_71,&local_249);
                    local_1a8[0] = 1;
                    local_1a8[1] = -1;
                    local_1a8[2] = -1;
                    local_1a8[3] = 1;
                    __l_72._M_len = 4;
                    __l_72._M_array = local_1a8;
                    std::vector<int,_std::allocator<int>_>::vector(&local_240,__l_72,&local_24a);
                    Lattice::addFace(&this->super_Lattice,vertexIndex,(int)local_248,&local_190,
                                     &local_240);
                    if (local_240.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start != (pointer)0x0) {
                      operator_delete(local_240.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_start,
                                      (long)local_240.super__Vector_base<int,_std::allocator<int>_>.
                                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)local_240.super__Vector_base<int,_std::allocator<int>_>.
                                            _M_impl.super__Vector_impl_data._M_start);
                    }
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::~vector(&local_190);
                    lVar8 = -0x80;
                    plVar7 = local_1b8;
                    do {
                      if (plVar7 != (long *)plVar7[-2]) {
                        operator_delete((long *)plVar7[-2],*plVar7 + 1);
                      }
                      plVar7 = plVar7 + -4;
                      lVar8 = lVar8 + 0x20;
                    } while (lVar8 != 0);
                    local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
                    std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"xyz","");
                    local_208[0] = local_1f8;
                    std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"xz","");
                    pLVar1 = local_198;
                    local_1e8[0] = local_1d8;
                    std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"xz","");
                    local_1c8[0] = local_1b8;
                    std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"xyz","");
                    __l_73._M_len = 4;
                    __l_73._M_array = &local_228;
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::vector(&local_190,__l_73,&local_249);
                    local_1a8[0] = -1;
                    local_1a8[1] = -1;
                    local_1a8[2] = -1;
                    local_1a8[3] = -1;
                    __l_74._M_len = 4;
                    __l_74._M_array = local_1a8;
                    std::vector<int,_std::allocator<int>_>::vector(&local_240,__l_74,&local_24a);
                    Lattice::addFace(pLVar1,vertexIndex,(int)local_248 + 1,&local_190,&local_240);
                    if (local_240.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start != (pointer)0x0) {
                      operator_delete(local_240.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_start,
                                      (long)local_240.super__Vector_base<int,_std::allocator<int>_>.
                                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)local_240.super__Vector_base<int,_std::allocator<int>_>.
                                            _M_impl.super__Vector_impl_data._M_start);
                    }
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::~vector(&local_190);
                    lVar8 = -0x80;
                    plVar7 = local_1b8;
                    do {
                      if (plVar7 != (long *)plVar7[-2]) {
                        operator_delete((long *)plVar7[-2],*plVar7 + 1);
                      }
                      plVar7 = plVar7 + -4;
                      lVar8 = lVar8 + 0x20;
                    } while (lVar8 != 0);
                    local_248 = (ulong)((int)local_248 + 2);
                    this = (RhombicLattice *)local_198;
                  }
                  local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"xz","");
                  local_208[0] = local_1f8;
                  std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"yz","");
                  local_1e8[0] = local_1d8;
                  std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"yz","");
                  local_1c8[0] = local_1b8;
                  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"xz","");
                  __l_75._M_len = 4;
                  __l_75._M_array = &local_228;
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::vector(&local_190,__l_75,&local_249);
                  local_1a8[0] = 1;
                  local_1a8[1] = -1;
                  local_1a8[2] = -1;
                  local_1a8[3] = 1;
                  __l_76._M_len = 4;
                  __l_76._M_array = local_1a8;
                  std::vector<int,_std::allocator<int>_>::vector(&local_240,__l_76,&local_24a);
                  Lattice::addFace(&this->super_Lattice,vertexIndex,(int)local_248,&local_190,
                                   &local_240);
                  if (local_240.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start != (pointer)0x0) {
                    operator_delete(local_240.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start,
                                    (long)local_240.super__Vector_base<int,_std::allocator<int>_>.
                                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                                    (long)local_240.super__Vector_base<int,_std::allocator<int>_>.
                                          _M_impl.super__Vector_impl_data._M_start);
                  }
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector(&local_190);
                  lVar8 = -0x80;
                  plVar7 = local_1b8;
                  do {
                    if (plVar7 != (long *)plVar7[-2]) {
                      operator_delete((long *)plVar7[-2],*plVar7 + 1);
                    }
                    plVar7 = plVar7 + -4;
                    lVar8 = lVar8 + 0x20;
                  } while (lVar8 != 0);
                  local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"xz","");
                  local_208[0] = local_1f8;
                  std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"yz","");
                  pLVar1 = local_198;
                  local_1e8[0] = local_1d8;
                  std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"yz","");
                  local_1c8[0] = local_1b8;
                  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"xz","");
                  __l_77._M_len = 4;
                  __l_77._M_array = &local_228;
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::vector(&local_190,__l_77,&local_249);
                  local_1a8[0] = -1;
                  local_1a8[1] = 1;
                  local_1a8[2] = 1;
                  local_1a8[3] = -1;
                  __l_78._M_len = 4;
                  __l_78._M_array = local_1a8;
                  std::vector<int,_std::allocator<int>_>::vector(&local_240,__l_78,&local_24a);
                  Lattice::addFace(pLVar1,vertexIndex,(int)local_248 + 1,&local_190,&local_240);
                  if (local_240.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start != (pointer)0x0) {
                    operator_delete(local_240.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start,
                                    (long)local_240.super__Vector_base<int,_std::allocator<int>_>.
                                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                                    (long)local_240.super__Vector_base<int,_std::allocator<int>_>.
                                          _M_impl.super__Vector_impl_data._M_start);
                  }
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector(&local_190);
                  lVar8 = -0x80;
                  plVar7 = local_1b8;
                  do {
                    if (plVar7 != (long *)plVar7[-2]) {
                      operator_delete((long *)plVar7[-2],*plVar7 + 1);
                    }
                    plVar7 = plVar7 + -4;
                    lVar8 = lVar8 + 0x20;
                  } while (lVar8 != 0);
                }
                local_248 = (ulong)((int)local_248 + 2);
                this = (RhombicLattice *)local_198;
              }
            }
          }
          else if (uVar2 == 0) {
            local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"xz","");
            local_208[0] = local_1f8;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"yz","");
            local_1e8[0] = local_1d8;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"yz","");
            local_1c8[0] = local_1b8;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"xz","");
            __l_11._M_len = 4;
            __l_11._M_array = &local_228;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::vector(&local_190,__l_11,&local_249);
            local_1a8[0] = 1;
            local_1a8[1] = -1;
            local_1a8[2] = -1;
            local_1a8[3] = 1;
            __l_12._M_len = 4;
            __l_12._M_array = local_1a8;
            std::vector<int,_std::allocator<int>_>::vector(&local_240,__l_12,&local_24a);
            Lattice::addFace(&this->super_Lattice,vertexIndex,(int)local_248,&local_190,&local_240);
            if (local_240.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_240.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start,
                              (long)local_240.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_end_of_storage -
                              (long)local_240.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start);
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_190);
            lVar8 = -0x80;
            plVar7 = local_1b8;
            do {
              if (plVar7 != (long *)plVar7[-2]) {
                operator_delete((long *)plVar7[-2],*plVar7 + 1);
              }
              plVar7 = plVar7 + -4;
              lVar8 = lVar8 + 0x20;
            } while (lVar8 != 0);
LAB_00126ebc:
            local_248 = (ulong)((int)local_248 + 1);
            this = (RhombicLattice *)local_198;
          }
          else {
            uVar5 = (this->super_Lattice).l - 1;
            if (uVar4 == 0) {
              if (uVar5 != uVar2) {
                local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"xyz","");
                local_208[0] = local_1f8;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"xy","");
                local_1e8[0] = local_1d8;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"xy","");
                local_1c8[0] = local_1b8;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"xyz","");
                __l_01._M_len = 4;
                __l_01._M_array = &local_228;
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::vector(&local_190,__l_01,&local_249);
                local_1a8[0] = 1;
                local_1a8[1] = 1;
                local_1a8[2] = 1;
                local_1a8[3] = 1;
                __l_02._M_len = 4;
                __l_02._M_array = local_1a8;
                std::vector<int,_std::allocator<int>_>::vector(&local_240,__l_02,&local_24a);
                Lattice::addFace(&this->super_Lattice,vertexIndex,(int)local_248,&local_190,
                                 &local_240);
                if (local_240.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_240.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start,
                                  (long)local_240.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_240.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_start);
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(&local_190);
                lVar8 = -0x80;
                plVar7 = local_1b8;
                do {
                  if (plVar7 != (long *)plVar7[-2]) {
                    operator_delete((long *)plVar7[-2],*plVar7 + 1);
                  }
                  plVar7 = plVar7 + -4;
                  lVar8 = lVar8 + 0x20;
                } while (lVar8 != 0);
                local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"xyz","");
                local_208[0] = local_1f8;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"yz","");
                pLVar1 = local_198;
                local_1e8[0] = local_1d8;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"yz","");
                local_1c8[0] = local_1b8;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"xyz","");
                __l_03._M_len = 4;
                __l_03._M_array = &local_228;
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::vector(&local_190,__l_03,&local_249);
                local_1a8[0] = 1;
                local_1a8[1] = 1;
                local_1a8[2] = 1;
                local_1a8[3] = 1;
                __l_04._M_len = 4;
                __l_04._M_array = local_1a8;
                std::vector<int,_std::allocator<int>_>::vector(&local_240,__l_04,&local_24a);
                Lattice::addFace(pLVar1,vertexIndex,(int)local_248 + 1,&local_190,&local_240);
                if (local_240.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_240.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start,
                                  (long)local_240.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_240.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_start);
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(&local_190);
                lVar8 = -0x80;
                plVar7 = local_1b8;
                do {
                  if (plVar7 != (long *)plVar7[-2]) {
                    operator_delete((long *)plVar7[-2],*plVar7 + 1);
                  }
                  plVar7 = plVar7 + -4;
                  lVar8 = lVar8 + 0x20;
                } while (lVar8 != 0);
                local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"xy","");
                local_208[0] = local_1f8;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"xz","");
                pLVar1 = local_198;
                local_1e8[0] = local_1d8;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"xz","");
                local_1c8[0] = local_1b8;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"xy","");
                __l_05._M_len = 4;
                __l_05._M_array = &local_228;
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::vector(&local_190,__l_05,&local_249);
                local_1a8[0] = 1;
                local_1a8[1] = -1;
                local_1a8[2] = -1;
                local_1a8[3] = 1;
                __l_06._M_len = 4;
                __l_06._M_array = local_1a8;
                std::vector<int,_std::allocator<int>_>::vector(&local_240,__l_06,&local_24a);
                Lattice::addFace(pLVar1,vertexIndex,(int)local_248 + 2,&local_190,&local_240);
                if (local_240.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_240.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start,
                                  (long)local_240.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_240.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_start);
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(&local_190);
                lVar8 = -0x80;
                plVar7 = local_1b8;
                do {
                  if (plVar7 != (long *)plVar7[-2]) {
                    operator_delete((long *)plVar7[-2],*plVar7 + 1);
                  }
                  plVar7 = plVar7 + -4;
                  lVar8 = lVar8 + 0x20;
                } while (lVar8 != 0);
LAB_0012729c:
                local_248 = (ulong)((int)local_248 + 3);
                this = (RhombicLattice *)local_198;
              }
            }
            else {
              if (uVar5 == uVar2) {
                local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"xyz","");
                local_208[0] = local_1f8;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"xy","");
                local_1e8[0] = local_1d8;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"xy","");
                local_1c8[0] = local_1b8;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"xyz","");
                __l_13._M_len = 4;
                __l_13._M_array = &local_228;
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::vector(&local_190,__l_13,&local_249);
                local_1a8[0] = -1;
                local_1a8[1] = -1;
                local_1a8[2] = -1;
                local_1a8[3] = -1;
                __l_14._M_len = 4;
                __l_14._M_array = local_1a8;
                std::vector<int,_std::allocator<int>_>::vector(&local_240,__l_14,&local_24a);
                Lattice::addFace(&this->super_Lattice,vertexIndex,(int)local_248,&local_190,
                                 &local_240);
                if (local_240.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_240.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start,
                                  (long)local_240.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_240.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_start);
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(&local_190);
                lVar8 = -0x80;
                plVar7 = local_1b8;
                do {
                  if (plVar7 != (long *)plVar7[-2]) {
                    operator_delete((long *)plVar7[-2],*plVar7 + 1);
                  }
                  plVar7 = plVar7 + -4;
                  lVar8 = lVar8 + 0x20;
                } while (lVar8 != 0);
                goto LAB_00126ebc;
              }
              if (uVar5 == uVar3) {
                local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"xz","");
                local_208[0] = local_1f8;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"yz","");
                local_1e8[0] = local_1d8;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"yz","");
                local_1c8[0] = local_1b8;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"xz","");
                __l_21._M_len = 4;
                __l_21._M_array = &local_228;
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::vector(&local_190,__l_21,&local_249);
                local_1a8[0] = 1;
                local_1a8[1] = -1;
                local_1a8[2] = -1;
                local_1a8[3] = 1;
                __l_22._M_len = 4;
                __l_22._M_array = local_1a8;
                std::vector<int,_std::allocator<int>_>::vector(&local_240,__l_22,&local_24a);
                Lattice::addFace(&this->super_Lattice,vertexIndex,(int)local_248,&local_190,
                                 &local_240);
                if (local_240.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_240.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start,
                                  (long)local_240.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_240.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_start);
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(&local_190);
                lVar8 = -0x80;
                plVar7 = local_1b8;
                do {
                  if (plVar7 != (long *)plVar7[-2]) {
                    operator_delete((long *)plVar7[-2],*plVar7 + 1);
                  }
                  plVar7 = plVar7 + -4;
                  lVar8 = lVar8 + 0x20;
                } while (lVar8 != 0);
                local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"xy","");
                local_208[0] = local_1f8;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"xz","");
                pLVar1 = local_198;
                local_1e8[0] = local_1d8;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"xz","");
                local_1c8[0] = local_1b8;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"xy","");
                __l_23._M_len = 4;
                __l_23._M_array = &local_228;
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::vector(&local_190,__l_23,&local_249);
                local_1a8[0] = -1;
                local_1a8[1] = 1;
                local_1a8[2] = 1;
                local_1a8[3] = -1;
                __l_24._M_len = 4;
                __l_24._M_array = local_1a8;
                std::vector<int,_std::allocator<int>_>::vector(&local_240,__l_24,&local_24a);
                Lattice::addFace(pLVar1,vertexIndex,(int)local_248 + 1,&local_190,&local_240);
                if (local_240.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_240.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start,
                                  (long)local_240.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_240.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_start);
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(&local_190);
                lVar8 = -0x80;
                plVar7 = local_1b8;
                do {
                  if (plVar7 != (long *)plVar7[-2]) {
                    operator_delete((long *)plVar7[-2],*plVar7 + 1);
                  }
                  plVar7 = plVar7 + -4;
                  lVar8 = lVar8 + 0x20;
                } while (lVar8 != 0);
                local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"xyz","");
                local_208[0] = local_1f8;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"yz","");
                pLVar1 = local_198;
                local_1e8[0] = local_1d8;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"yz","");
                local_1c8[0] = local_1b8;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"xyz","");
                __l_25._M_len = 4;
                __l_25._M_array = &local_228;
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::vector(&local_190,__l_25,&local_249);
                local_1a8[0] = -1;
                local_1a8[1] = -1;
                local_1a8[2] = -1;
                local_1a8[3] = -1;
                __l_26._M_len = 4;
                __l_26._M_array = local_1a8;
                std::vector<int,_std::allocator<int>_>::vector(&local_240,__l_26,&local_24a);
                Lattice::addFace(pLVar1,vertexIndex,(int)local_248 + 2,&local_190,&local_240);
                if (local_240.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_240.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start,
                                  (long)local_240.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_240.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_start);
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(&local_190);
                lVar8 = -0x80;
                plVar7 = local_1b8;
                do {
                  if (plVar7 != (long *)plVar7[-2]) {
                    operator_delete((long *)plVar7[-2],*plVar7 + 1);
                  }
                  plVar7 = plVar7 + -4;
                  lVar8 = lVar8 + 0x20;
                } while (lVar8 != 0);
                goto LAB_0012729c;
              }
              if ((uVar3 & 0x80000001) == 1 && (int)uVar2 % 2 == 0) {
                local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"xz","");
                local_208[0] = local_1f8;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"xy","");
                local_1e8[0] = local_1d8;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"xy","");
                local_1c8[0] = local_1b8;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"xz","");
                __l_33._M_len = 4;
                __l_33._M_array = &local_228;
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::vector(&local_190,__l_33,&local_249);
                local_1a8[0] = 1;
                local_1a8[1] = -1;
                local_1a8[2] = -1;
                local_1a8[3] = 1;
                __l_34._M_len = 4;
                __l_34._M_array = local_1a8;
                std::vector<int,_std::allocator<int>_>::vector(&local_240,__l_34,&local_24a);
                Lattice::addFace(&this->super_Lattice,vertexIndex,(int)local_248,&local_190,
                                 &local_240);
                if (local_240.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_240.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start,
                                  (long)local_240.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_240.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_start);
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(&local_190);
                lVar8 = -0x80;
                plVar7 = local_1b8;
                do {
                  if (plVar7 != (long *)plVar7[-2]) {
                    operator_delete((long *)plVar7[-2],*plVar7 + 1);
                  }
                  plVar7 = plVar7 + -4;
                  lVar8 = lVar8 + 0x20;
                } while (lVar8 != 0);
                local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"xyz","");
                local_208[0] = local_1f8;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"yz","");
                pLVar1 = local_198;
                local_1e8[0] = local_1d8;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"yz","");
                local_1c8[0] = local_1b8;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"xyz","");
                __l_35._M_len = 4;
                __l_35._M_array = &local_228;
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::vector(&local_190,__l_35,&local_249);
                local_1a8[0] = -1;
                local_1a8[1] = -1;
                local_1a8[2] = -1;
                local_1a8[3] = -1;
                __l_36._M_len = 4;
                __l_36._M_array = local_1a8;
                std::vector<int,_std::allocator<int>_>::vector(&local_240,__l_36,&local_24a);
                Lattice::addFace(pLVar1,vertexIndex,(int)local_248 + 1,&local_190,&local_240);
                if (local_240.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_240.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start,
                                  (long)local_240.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_240.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_start);
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(&local_190);
                lVar8 = -0x80;
                plVar7 = local_1b8;
                do {
                  if (plVar7 != (long *)plVar7[-2]) {
                    operator_delete((long *)plVar7[-2],*plVar7 + 1);
                  }
                  plVar7 = plVar7 + -4;
                  lVar8 = lVar8 + 0x20;
                } while (lVar8 != 0);
                local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"xyz","");
                local_208[0] = local_1f8;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"yz","");
                pLVar1 = local_198;
                local_1e8[0] = local_1d8;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"yz","");
                local_1c8[0] = local_1b8;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"xyz","");
                __l_37._M_len = 4;
                __l_37._M_array = &local_228;
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::vector(&local_190,__l_37,&local_249);
                local_1a8[0] = 1;
                local_1a8[1] = 1;
                local_1a8[2] = 1;
                local_1a8[3] = 1;
                __l_38._M_len = 4;
                __l_38._M_array = local_1a8;
                std::vector<int,_std::allocator<int>_>::vector(&local_240,__l_38,&local_24a);
                Lattice::addFace(pLVar1,vertexIndex,(int)local_248 + 2,&local_190,&local_240);
                if (local_240.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_240.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start,
                                  (long)local_240.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_240.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_start);
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(&local_190);
                lVar8 = -0x80;
                plVar7 = local_1b8;
                do {
                  if (plVar7 != (long *)plVar7[-2]) {
                    operator_delete((long *)plVar7[-2],*plVar7 + 1);
                  }
                  plVar7 = plVar7 + -4;
                  lVar8 = lVar8 + 0x20;
                } while (lVar8 != 0);
                local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"xz","");
                local_208[0] = local_1f8;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"xy","");
                pLVar1 = local_198;
                local_1e8[0] = local_1d8;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"xy","");
                local_1c8[0] = local_1b8;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"xz","");
                __l_39._M_len = 4;
                __l_39._M_array = &local_228;
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::vector(&local_190,__l_39,&local_249);
                local_1a8[0] = -1;
                local_1a8[1] = 1;
                local_1a8[2] = 1;
                local_1a8[3] = -1;
                __l_40._M_len = 4;
                __l_40._M_array = local_1a8;
                std::vector<int,_std::allocator<int>_>::vector(&local_240,__l_40,&local_24a);
                Lattice::addFace(pLVar1,vertexIndex,(int)local_248 + 3,&local_190,&local_240);
                if (local_240.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_240.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start,
                                  (long)local_240.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_240.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_start);
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(&local_190);
                lVar8 = -0x80;
                plVar7 = local_1b8;
                do {
                  if (plVar7 != (long *)plVar7[-2]) {
                    operator_delete((long *)plVar7[-2],*plVar7 + 1);
                  }
                  plVar7 = plVar7 + -4;
                  lVar8 = lVar8 + 0x20;
                } while (lVar8 != 0);
                local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"xz","");
                local_208[0] = local_1f8;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"yz","");
                pLVar1 = local_198;
                local_1e8[0] = local_1d8;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"yz","");
                local_1c8[0] = local_1b8;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"xz","");
                __l_41._M_len = 4;
                __l_41._M_array = &local_228;
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::vector(&local_190,__l_41,&local_249);
                local_1a8[0] = 1;
                local_1a8[1] = -1;
                local_1a8[2] = -1;
                local_1a8[3] = 1;
                __l_42._M_len = 4;
                __l_42._M_array = local_1a8;
                std::vector<int,_std::allocator<int>_>::vector(&local_240,__l_42,&local_24a);
                Lattice::addFace(pLVar1,vertexIndex,(int)local_248 + 4,&local_190,&local_240);
                if (local_240.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_240.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start,
                                  (long)local_240.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_240.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_start);
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(&local_190);
                lVar8 = -0x80;
                plVar7 = local_1b8;
                do {
                  if (plVar7 != (long *)plVar7[-2]) {
                    operator_delete((long *)plVar7[-2],*plVar7 + 1);
                  }
                  plVar7 = plVar7 + -4;
                  lVar8 = lVar8 + 0x20;
                } while (lVar8 != 0);
                local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"xz","");
                local_208[0] = local_1f8;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"yz","");
                pLVar1 = local_198;
                local_1e8[0] = local_1d8;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"yz","");
                local_1c8[0] = local_1b8;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"xz","");
                __l_43._M_len = 4;
                __l_43._M_array = &local_228;
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::vector(&local_190,__l_43,&local_249);
                local_1a8[0] = -1;
                local_1a8[1] = 1;
                local_1a8[2] = 1;
                local_1a8[3] = -1;
                __l_44._M_len = 4;
                __l_44._M_array = local_1a8;
                std::vector<int,_std::allocator<int>_>::vector(&local_240,__l_44,&local_24a);
                Lattice::addFace(pLVar1,vertexIndex,(int)local_248 + 5,&local_190,&local_240);
                if (local_240.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_240.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start,
                                  (long)local_240.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_240.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_start);
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(&local_190);
                lVar8 = -0x80;
                plVar7 = local_1b8;
                do {
                  if (plVar7 != (long *)plVar7[-2]) {
                    operator_delete((long *)plVar7[-2],*plVar7 + 1);
                  }
                  plVar7 = plVar7 + -4;
                  lVar8 = lVar8 + 0x20;
                } while (lVar8 != 0);
              }
              else {
                if (((undefined1  [16])cVar10 & (undefined1  [16])0x100000000) !=
                    (undefined1  [16])0x0 || (int)uVar2 % 2 != 1) goto LAB_001294c5;
                local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"xyz","");
                local_208[0] = local_1f8;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"yz","");
                local_1e8[0] = local_1d8;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"yz","");
                local_1c8[0] = local_1b8;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"xyz","");
                __l_45._M_len = 4;
                __l_45._M_array = &local_228;
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::vector(&local_190,__l_45,&local_249);
                local_1a8[0] = 1;
                local_1a8[1] = 1;
                local_1a8[2] = 1;
                local_1a8[3] = 1;
                __l_46._M_len = 4;
                __l_46._M_array = local_1a8;
                std::vector<int,_std::allocator<int>_>::vector(&local_240,__l_46,&local_24a);
                Lattice::addFace(&this->super_Lattice,vertexIndex,(int)local_248,&local_190,
                                 &local_240);
                if (local_240.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_240.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start,
                                  (long)local_240.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_240.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_start);
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(&local_190);
                lVar8 = -0x80;
                plVar7 = local_1b8;
                do {
                  if (plVar7 != (long *)plVar7[-2]) {
                    operator_delete((long *)plVar7[-2],*plVar7 + 1);
                  }
                  plVar7 = plVar7 + -4;
                  lVar8 = lVar8 + 0x20;
                } while (lVar8 != 0);
                local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"xz","");
                local_208[0] = local_1f8;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"xy","");
                pLVar1 = local_198;
                local_1e8[0] = local_1d8;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"xy","");
                local_1c8[0] = local_1b8;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"xz","");
                __l_47._M_len = 4;
                __l_47._M_array = &local_228;
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::vector(&local_190,__l_47,&local_249);
                local_1a8[0] = -1;
                local_1a8[1] = 1;
                local_1a8[2] = 1;
                local_1a8[3] = -1;
                __l_48._M_len = 4;
                __l_48._M_array = local_1a8;
                std::vector<int,_std::allocator<int>_>::vector(&local_240,__l_48,&local_24a);
                Lattice::addFace(pLVar1,vertexIndex,(int)local_248 + 1,&local_190,&local_240);
                if (local_240.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_240.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start,
                                  (long)local_240.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_240.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_start);
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(&local_190);
                lVar8 = -0x80;
                plVar7 = local_1b8;
                do {
                  if (plVar7 != (long *)plVar7[-2]) {
                    operator_delete((long *)plVar7[-2],*plVar7 + 1);
                  }
                  plVar7 = plVar7 + -4;
                  lVar8 = lVar8 + 0x20;
                } while (lVar8 != 0);
                local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"xz","");
                local_208[0] = local_1f8;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"xy","");
                pLVar1 = local_198;
                local_1e8[0] = local_1d8;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"xy","");
                local_1c8[0] = local_1b8;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"xz","");
                __l_49._M_len = 4;
                __l_49._M_array = &local_228;
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::vector(&local_190,__l_49,&local_249);
                local_1a8[0] = 1;
                local_1a8[1] = -1;
                local_1a8[2] = -1;
                local_1a8[3] = 1;
                __l_50._M_len = 4;
                __l_50._M_array = local_1a8;
                std::vector<int,_std::allocator<int>_>::vector(&local_240,__l_50,&local_24a);
                Lattice::addFace(pLVar1,vertexIndex,(int)local_248 + 2,&local_190,&local_240);
                if (local_240.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_240.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start,
                                  (long)local_240.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_240.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_start);
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(&local_190);
                lVar8 = -0x80;
                plVar7 = local_1b8;
                do {
                  if (plVar7 != (long *)plVar7[-2]) {
                    operator_delete((long *)plVar7[-2],*plVar7 + 1);
                  }
                  plVar7 = plVar7 + -4;
                  lVar8 = lVar8 + 0x20;
                } while (lVar8 != 0);
                local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"xyz","");
                local_208[0] = local_1f8;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"yz","");
                pLVar1 = local_198;
                local_1e8[0] = local_1d8;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"yz","");
                local_1c8[0] = local_1b8;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"xyz","");
                __l_51._M_len = 4;
                __l_51._M_array = &local_228;
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::vector(&local_190,__l_51,&local_249);
                local_1a8[0] = -1;
                local_1a8[1] = -1;
                local_1a8[2] = -1;
                local_1a8[3] = -1;
                __l_52._M_len = 4;
                __l_52._M_array = local_1a8;
                std::vector<int,_std::allocator<int>_>::vector(&local_240,__l_52,&local_24a);
                Lattice::addFace(pLVar1,vertexIndex,(int)local_248 + 3,&local_190,&local_240);
                if (local_240.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_240.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start,
                                  (long)local_240.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_240.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_start);
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(&local_190);
                lVar8 = -0x80;
                plVar7 = local_1b8;
                do {
                  if (plVar7 != (long *)plVar7[-2]) {
                    operator_delete((long *)plVar7[-2],*plVar7 + 1);
                  }
                  plVar7 = plVar7 + -4;
                  lVar8 = lVar8 + 0x20;
                } while (lVar8 != 0);
                local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"xyz","");
                local_208[0] = local_1f8;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"xy","");
                pLVar1 = local_198;
                local_1e8[0] = local_1d8;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"xy","");
                local_1c8[0] = local_1b8;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"xyz","");
                __l_53._M_len = 4;
                __l_53._M_array = &local_228;
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::vector(&local_190,__l_53,&local_249);
                local_1a8[0] = 1;
                local_1a8[1] = 1;
                local_1a8[2] = 1;
                local_1a8[3] = 1;
                __l_54._M_len = 4;
                __l_54._M_array = local_1a8;
                std::vector<int,_std::allocator<int>_>::vector(&local_240,__l_54,&local_24a);
                Lattice::addFace(pLVar1,vertexIndex,(int)local_248 + 4,&local_190,&local_240);
                if (local_240.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_240.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start,
                                  (long)local_240.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_240.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_start);
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(&local_190);
                lVar8 = -0x80;
                plVar7 = local_1b8;
                do {
                  if (plVar7 != (long *)plVar7[-2]) {
                    operator_delete((long *)plVar7[-2],*plVar7 + 1);
                  }
                  plVar7 = plVar7 + -4;
                  lVar8 = lVar8 + 0x20;
                } while (lVar8 != 0);
                local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"xyz","");
                local_208[0] = local_1f8;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"xy","");
                pLVar1 = local_198;
                local_1e8[0] = local_1d8;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"xy","");
                local_1c8[0] = local_1b8;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"xyz","");
                __l_55._M_len = 4;
                __l_55._M_array = &local_228;
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::vector(&local_190,__l_55,&local_249);
                local_1a8[0] = -1;
                local_1a8[1] = -1;
                local_1a8[2] = -1;
                local_1a8[3] = -1;
                __l_56._M_len = 4;
                __l_56._M_array = local_1a8;
                std::vector<int,_std::allocator<int>_>::vector(&local_240,__l_56,&local_24a);
                Lattice::addFace(pLVar1,vertexIndex,(int)local_248 + 5,&local_190,&local_240);
                if (local_240.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_240.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start,
                                  (long)local_240.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_240.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_start);
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(&local_190);
                lVar8 = -0x80;
                plVar7 = local_1b8;
                do {
                  if (plVar7 != (long *)plVar7[-2]) {
                    operator_delete((long *)plVar7[-2],*plVar7 + 1);
                  }
                  plVar7 = plVar7 + -4;
                  lVar8 = lVar8 + 0x20;
                } while (lVar8 != 0);
              }
              local_248 = (ulong)((int)local_248 + 6);
              this = (RhombicLattice *)local_198;
            }
          }
        }
      }
LAB_001294c5:
      vertexIndex = vertexIndex + 1;
      local_38 = (double)vertexIndex;
      dVar9 = pow((double)(this->super_Lattice).l,3.0);
    } while (local_38 < dVar9);
  }
  return;
}

Assistant:

void RhombicLattice::createFaces()
{
    int faceIndex = 0;
    for (int vertexIndex = 0; vertexIndex < pow(l, 3); ++vertexIndex)
    {
        cartesian4 coordinate = indexToCoordinate(vertexIndex);
        if ((coordinate.x + coordinate.y + coordinate.z) % 2 == 1)
        {
            if (coordinate.z == 0)
            {
                continue;
            }
            else if (coordinate.z % 2 == 1)
            {
                if (coordinate.y == 0)
                {
                    addFace(vertexIndex, faceIndex, {"xyz", "xy", "xy", "xyz"}, {1, 1, 1, 1});
                    ++faceIndex;
                }
                else if (coordinate.x == 0)
                {
                    addFace(vertexIndex, faceIndex, {"xyz", "xy", "xy", "xyz"}, {1, 1, 1, 1});
                    ++faceIndex;
                    if (coordinate.z != l - 1)
                    {
                        addFace(vertexIndex, faceIndex, {"xyz", "xz", "xz", "xyz"}, {1, 1, 1, 1});
                        ++faceIndex;
                    }
                    if (coordinate.z != 1)
                    {
                        addFace(vertexIndex, faceIndex, {"xy", "yz", "yz", "xy"}, {1, -1, -1, 1});
                        ++faceIndex;
                    }
                }
                else if (coordinate.x == l - 1)
                {
                    if (coordinate.y == l - 1)
                    {
                        continue;
                    }
                    addFace(vertexIndex, faceIndex, {"yz", "xz", "xz", "yz"}, {1, -1, -1, 1});
                    ++faceIndex;
                    if (coordinate.z != l - 1)
                    {
                        addFace(vertexIndex, faceIndex, {"xy", "yz", "yz", "xy"}, {-1, 1, 1, -1});
                        ++faceIndex;
                    }
                    if (coordinate.z != 1)
                    {
                        addFace(vertexIndex, faceIndex, {"xyz", "xz", "xz", "xyz"}, {-1, -1, -1, -1});
                        ++faceIndex;
                    }
                }
                else if (coordinate.y == l - 1)
                {
                    addFace(vertexIndex, faceIndex, {"xz", "yz", "yz", "xz"}, {1, -1, -1, 1});
                    ++faceIndex;
                }
                else if (coordinate.x % 2 == 0 && coordinate.y % 2 == 0)
                {
                    if (coordinate.z != l - 1)
                    {
                        addFace(vertexIndex, faceIndex, {"xyz", "xz", "xz", "xyz"}, {1, 1, 1, 1});
                        ++faceIndex;
                        addFace(vertexIndex, faceIndex, {"xy", "yz", "yz", "xy"}, {-1, 1, 1, -1});
                        ++faceIndex;
                    }
                    if (coordinate.z != 1)
                    {
                        addFace(vertexIndex, faceIndex, {"xy", "yz", "yz", "xy"}, {1, -1, -1, 1});
                        ++faceIndex;
                        addFace(vertexIndex, faceIndex, {"xyz", "xz", "xz", "xyz"}, {-1, -1, -1, -1});
                        ++faceIndex;
                    }
                    addFace(vertexIndex, faceIndex, {"xyz", "xy", "xy", "xyz"}, {1, 1, 1, 1});
                    ++faceIndex;
                    addFace(vertexIndex, faceIndex, {"xyz", "xy", "xy", "xyz"}, {-1, -1, -1, -1});
                    ++faceIndex;
                }
                else if (coordinate.x % 2 == 1 && coordinate.y % 2 == 1)
                {
                    if (coordinate.z != l - 1)
                    {
                        addFace(vertexIndex, faceIndex, {"xyz", "xz", "xz", "xyz"}, {1, 1, 1, 1});
                        ++faceIndex;
                        addFace(vertexIndex, faceIndex, {"xy", "yz", "yz", "xy"}, {-1, 1, 1, -1});
                        ++faceIndex;
                    }
                    if (coordinate.z != 1)
                    {
                        addFace(vertexIndex, faceIndex, {"xy", "yz", "yz", "xy"}, {1, -1, -1, 1});
                        ++faceIndex;
                        addFace(vertexIndex, faceIndex, {"xyz", "xz", "xz", "xyz"}, {-1, -1, -1, -1});
                        ++faceIndex;
                    }
                    addFace(vertexIndex, faceIndex, {"xz", "yz", "yz", "xz"}, {1, -1, -1, 1});
                    ++faceIndex;
                    addFace(vertexIndex, faceIndex, {"xz", "yz", "yz", "xz"}, {-1, 1, 1, -1});
                    ++faceIndex;
                }
            }
            else
            {
                if (coordinate.x == 0)
                {
                    addFace(vertexIndex, faceIndex, {"xz", "yz", "yz", "xz"}, {1, -1, -1, 1});
                    ++faceIndex;
                }
                else if (coordinate.y == 0)
                {
                    if (coordinate.x == l - 1)
                    {
                        continue;
                    }
                    addFace(vertexIndex, faceIndex, {"xyz", "xy", "xy", "xyz"}, {1, 1, 1, 1});
                    ++faceIndex;
                    addFace(vertexIndex, faceIndex, {"xyz", "yz", "yz", "xyz"}, {1, 1, 1, 1});
                    ++faceIndex;
                    addFace(vertexIndex, faceIndex, {"xy", "xz", "xz", "xy"}, {1, -1, -1, 1});
                    ++faceIndex;
                }
                else if (coordinate.x == l - 1)
                {
                    addFace(vertexIndex, faceIndex, {"xyz", "xy", "xy", "xyz"}, {-1, -1, -1, -1});
                    ++faceIndex;
                }
                else if (coordinate.y == l - 1)
                {
                    addFace(vertexIndex, faceIndex, {"xz", "yz", "yz", "xz"}, {1, -1, -1, 1});
                    ++faceIndex;
                    addFace(vertexIndex, faceIndex, {"xy", "xz", "xz", "xy"}, {-1, 1, 1, -1});
                    ++faceIndex;
                    addFace(vertexIndex, faceIndex, {"xyz", "yz", "yz", "xyz"}, {-1, -1, -1, -1});
                    ++faceIndex;
                }
                else if (coordinate.x % 2 == 0 && coordinate.y % 2 == 1)
                {
                    addFace(vertexIndex, faceIndex, {"xz", "xy", "xy", "xz"}, {1, -1, -1, 1});
                    ++faceIndex;
                    addFace(vertexIndex, faceIndex, {"xyz", "yz", "yz", "xyz"}, {-1, -1, -1, -1});
                    ++faceIndex;
                    addFace(vertexIndex, faceIndex, {"xyz", "yz", "yz", "xyz"}, {1, 1, 1, 1});
                    ++faceIndex;
                    addFace(vertexIndex, faceIndex, {"xz", "xy", "xy", "xz"}, {-1, 1, 1, -1});
                    ++faceIndex;
                    addFace(vertexIndex, faceIndex, {"xz", "yz", "yz", "xz"}, {1, -1, -1, 1});
                    ++faceIndex;
                    addFace(vertexIndex, faceIndex, {"xz", "yz", "yz", "xz"}, {-1, 1, 1, -1});
                    ++faceIndex;
                }
                else if (coordinate.x % 2 == 1 && coordinate.y % 2 == 0)
                {
                    addFace(vertexIndex, faceIndex, {"xyz", "yz", "yz", "xyz"}, {1, 1, 1, 1});
                    ++faceIndex;
                    addFace(vertexIndex, faceIndex, {"xz", "xy", "xy", "xz"}, {-1, 1, 1, -1});
                    ++faceIndex;
                    addFace(vertexIndex, faceIndex, {"xz", "xy", "xy", "xz"}, {1, -1, -1, 1});
                    ++faceIndex;
                    addFace(vertexIndex, faceIndex, {"xyz", "yz", "yz", "xyz"}, {-1, -1, -1, -1});
                    ++faceIndex;
                    addFace(vertexIndex, faceIndex, {"xyz", "xy", "xy", "xyz"}, {1, 1, 1, 1});
                    ++faceIndex;
                    addFace(vertexIndex, faceIndex, {"xyz", "xy", "xy", "xyz"}, {-1, -1, -1, -1});
                    ++faceIndex;
                }
            }
        }
    }
}